

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasSlCrank_dns.c
# Opt level: O1

void force(N_Vector yy,sunrealtype *Q,UserData data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  dVar1 = data->a;
  dVar2 = data->l0;
  dVar3 = data->params[0];
  dVar4 = data->params[1];
  dVar5 = data->F;
  pdVar12 = *(double **)((long)yy->content + 0x10);
  dVar6 = *pdVar12;
  dVar7 = pdVar12[1];
  dVar8 = pdVar12[2];
  dVar9 = pdVar12[3];
  dVar10 = pdVar12[4];
  dVar11 = pdVar12[5];
  dVar13 = sin(dVar6);
  dVar6 = cos(dVar6);
  dVar14 = sin(dVar8);
  dVar8 = cos(dVar8);
  dVar19 = dVar14 * dVar6 - dVar13 * dVar8;
  dVar17 = dVar6 * dVar1 + dVar8;
  dVar18 = (dVar8 * dVar6 + dVar13 * dVar14) * dVar1 * 0.5 +
           (dVar1 * dVar1 + 1.0) * 0.25 + (dVar7 * dVar7 - dVar17 * dVar7);
  if (dVar18 < 0.0) {
    dVar18 = sqrt(dVar18);
  }
  else {
    dVar18 = SQRT(dVar18);
  }
  dVar16 = dVar1 * dVar19;
  dVar18 = (dVar3 * (dVar18 - dVar2) +
           dVar4 * (((dVar11 - dVar9) * dVar16 * -0.5 +
                    (dVar14 * dVar11 + dVar1 * dVar13 * dVar9) * dVar7 +
                    ((dVar7 + dVar7) * dVar10 - dVar17 * dVar10)) / (dVar18 + dVar18))) / dVar18;
  *Q = (dVar13 * dVar7 + dVar19 * 0.5) * dVar1 * dVar18 * -0.5;
  dVar2 = (dVar7 * dVar14 + dVar16 * -0.5) * dVar18 * -0.5 + dVar14 * -dVar5;
  auVar15._8_4_ = SUB84(dVar2,0);
  auVar15._0_8_ = dVar5 + (dVar6 * dVar1 * 0.5 + (dVar8 * 0.5 - dVar7)) * dVar18;
  auVar15._12_4_ = (int)((ulong)dVar2 >> 0x20);
  *(undefined1 (*) [16])(Q + 1) = auVar15;
  return;
}

Assistant:

static void force(N_Vector yy, sunrealtype* Q, UserData data)
{
  sunrealtype a, k, c, l0, F;
  sunrealtype q, x, p;
  sunrealtype qd, xd, pd;
  sunrealtype s1, c1, s2, c2, s21, c21;
  sunrealtype l2, l, ld;
  sunrealtype f, fl;

  a  = data->a;
  k  = data->params[0];
  c  = data->params[1];
  l0 = data->l0;
  F  = data->F;

  q = NV_Ith_S(yy, 0);
  x = NV_Ith_S(yy, 1);
  p = NV_Ith_S(yy, 2);

  qd = NV_Ith_S(yy, 3);
  xd = NV_Ith_S(yy, 4);
  pd = NV_Ith_S(yy, 5);

  s1  = sin(q);
  c1  = cos(q);
  s2  = sin(p);
  c2  = cos(p);
  s21 = s2 * c1 - c2 * s1;
  c21 = c2 * c1 + s2 * s1;

  l2 = x * x - x * (c2 + a * c1) + (ONE + a * a) / FOUR + a * c21 / TWO;
  l  = sqrt(l2);
  ld = TWO * x * xd - xd * (c2 + a * c1) + x * (s2 * pd + a * s1 * qd) -
       a * s21 * (pd - qd) / TWO;
  ld /= TWO * l;

  f  = k * (l - l0) + c * ld;
  fl = f / l;

  Q[0] = -fl * a * (s21 / TWO + x * s1) / TWO;
  Q[1] = fl * (c2 / TWO - x + a * c1 / TWO) + F;
  Q[2] = -fl * (x * s2 - a * s21 / TWO) / TWO - F * s2;
}